

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio.c
# Opt level: O0

void mode_list(cpio *cpio)

{
  FILE *__stream;
  wchar_t wVar1;
  int iVar2;
  char *pcVar3;
  la_int64_t lVar4;
  long lVar5;
  int64_t blocks;
  archive_entry *paStack_20;
  int r;
  archive_entry *entry;
  archive *a;
  cpio *cpio_local;
  
  a = (archive *)cpio;
  entry = (archive_entry *)archive_read_new();
  if (entry == (archive_entry *)0x0) {
    lafe_errc(1,0,"Couldn\'t allocate archive object");
  }
  archive_read_support_filter_all((archive *)entry);
  archive_read_support_format_all((archive *)entry);
  if (*(int *)((long)&a->read_data_block + 4) != 0) {
    archive_read_set_options((archive *)entry,"pwb");
  }
  if (a[1].error == (char *)0x0) {
    blocks._4_4_ = archive_read_set_passphrase_callback((archive *)entry,a,passphrase_callback);
  }
  else {
    blocks._4_4_ = archive_read_add_passphrase((archive *)entry,a[1].error);
  }
  if (blocks._4_4_ == 0) {
    wVar1 = archive_read_open_filename
                      ((archive *)entry,*(char **)&a->archive_format,(long)*(int *)&a->error);
    if (wVar1 != L'\0') {
      iVar2 = archive_errno((archive *)entry);
      pcVar3 = archive_error_string((archive *)entry);
      lafe_errc(1,iVar2,"%s",pcVar3);
    }
    while( true ) {
      iVar2 = archive_read_next_header((archive *)entry,&stack0xffffffffffffffe0);
      if (iVar2 == 1) {
        iVar2 = archive_read_close((archive *)entry);
        if (iVar2 == 0) {
          if (*(int *)((long)&(a->error_string).s + 4) == 0) {
            lVar4 = archive_filter_bytes((archive *)entry,0);
            lVar5 = (lVar4 + 0x1ff) / 0x200;
            pcVar3 = "blocks";
            if (lVar5 == 1) {
              pcVar3 = "block";
            }
            fprintf(_stderr,"%lu %s\n",lVar5,pcVar3);
          }
          archive_read_free((archive *)entry);
          exit(0);
        }
        pcVar3 = archive_error_string((archive *)entry);
        lafe_errc(1,0,"%s",pcVar3);
      }
      if (iVar2 != 0) break;
      wVar1 = archive_match_path_excluded((archive *)a[1].read_data_remaining,paStack_20);
      __stream = _stdout;
      if (wVar1 == L'\0') {
        if (*(int *)((long)&a->error + 4) == 0) {
          pcVar3 = archive_entry_pathname(paStack_20);
          fprintf(__stream,"%s\n",pcVar3);
        }
        else {
          list_item_verbose((cpio *)a,paStack_20);
        }
      }
    }
    iVar2 = archive_errno((archive *)entry);
    pcVar3 = archive_error_string((archive *)entry);
    lafe_errc(1,iVar2,"%s",pcVar3);
  }
  pcVar3 = archive_error_string((archive *)entry);
  lafe_errc(1,0,"%s",pcVar3);
}

Assistant:

static void
mode_list(struct cpio *cpio)
{
	struct archive *a;
	struct archive_entry *entry;
	int r;

	a = archive_read_new();
	if (a == NULL)
		lafe_errc(1, 0, "Couldn't allocate archive object");
	archive_read_support_filter_all(a);
	archive_read_support_format_all(a);
	if (cpio->option_pwb)
		archive_read_set_options(a, "pwb");
	if (cpio->passphrase != NULL)
		r = archive_read_add_passphrase(a, cpio->passphrase);
	else
		r = archive_read_set_passphrase_callback(a, cpio,
			&passphrase_callback);
	if (r != ARCHIVE_OK)
		lafe_errc(1, 0, "%s", archive_error_string(a));

	if (archive_read_open_filename(a, cpio->filename,
					cpio->bytes_per_block))
		lafe_errc(1, archive_errno(a),
		    "%s", archive_error_string(a));
	for (;;) {
		r = archive_read_next_header(a, &entry);
		if (r == ARCHIVE_EOF)
			break;
		if (r != ARCHIVE_OK) {
			lafe_errc(1, archive_errno(a),
			    "%s", archive_error_string(a));
		}
		if (archive_match_path_excluded(cpio->matching, entry))
			continue;
		if (cpio->verbose)
			list_item_verbose(cpio, entry);
		else
			fprintf(stdout, "%s\n", archive_entry_pathname(entry));
	}
	r = archive_read_close(a);
	if (r != ARCHIVE_OK)
		lafe_errc(1, 0, "%s", archive_error_string(a));
	if (!cpio->quiet) {
		int64_t blocks = (archive_filter_bytes(a, 0) + 511)
			      / 512;
		fprintf(stderr, "%lu %s\n", (unsigned long)blocks,
		    blocks == 1 ? "block" : "blocks");
	}
	archive_read_free(a);
	exit(0);
}